

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O3

void __thiscall rw::TexDictionary::streamWrite(TexDictionary *this,Stream *stream)

{
  LinkList *pLVar1;
  LLLink *pLVar2;
  short val;
  uint32 uVar3;
  int iVar4;
  LLLink *pLVar5;
  Texture *this_00;
  
  uVar3 = streamGetSize(this);
  writeChunkHeader(stream,0x16,uVar3);
  writeChunkHeader(stream,1,4);
  pLVar1 = &this->textures;
  val = -1;
  pLVar5 = &pLVar1->link;
  do {
    pLVar5 = ((LLLink *)&pLVar5->next)->next;
    val = val + 1;
  } while (pLVar5 != &pLVar1->link);
  Stream::writeI16(stream,val);
  Stream::writeI16(stream,0);
  pLVar5 = (pLVar1->link).next;
  while (pLVar5 != &pLVar1->link) {
    pLVar2 = pLVar5->next;
    this_00 = (Texture *)(pLVar5 + -1);
    uVar3 = Texture::streamGetSizeNative(this_00);
    iVar4 = PluginList::streamGetSize((PluginList *)&Texture::s_plglist,this_00);
    writeChunkHeader(stream,0x15,iVar4 + uVar3 + 0xc);
    Texture::streamWriteNative(this_00,stream);
    PluginList::streamWrite((PluginList *)&Texture::s_plglist,stream,this_00);
    pLVar5 = pLVar2;
  }
  PluginList::streamWrite((PluginList *)&s_plglist,stream,this);
  return;
}

Assistant:

void
TexDictionary::streamWrite(Stream *stream)
{
	writeChunkHeader(stream, ID_TEXDICTIONARY, this->streamGetSize());
	writeChunkHeader(stream, ID_STRUCT, 4);
	int32 numTex = this->count();
	stream->writeI16(numTex);
	stream->writeI16(0);
	FORLIST(lnk, this->textures){
		Texture *tex = Texture::fromDict(lnk);
		uint32 sz = tex->streamGetSizeNative();
		sz += 12 + Texture::s_plglist.streamGetSize(tex);
		writeChunkHeader(stream, ID_TEXTURENATIVE, sz);
		tex->streamWriteNative(stream);
		Texture::s_plglist.streamWrite(stream, tex);
	}
	s_plglist.streamWrite(stream, this);
}